

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parquet_metadata.cpp
# Opt level: O1

unique_ptr<duckdb::FunctionData,_std::default_delete<duckdb::FunctionData>,_true> __thiscall
duckdb::ParquetMetaDataBind<(duckdb::ParquetMetadataOperatorType)4>
          (duckdb *this,ClientContext *context,TableFunctionBindInput *input,
          vector<duckdb::LogicalType,_true> *return_types,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
          *names)

{
  _Head_base<0UL,_duckdb::MultiFileReader_*,_false> _Var1;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this_00;
  _Tuple_impl<0UL,_duckdb::ParquetBloomProbeBindData_*,_std::default_delete<duckdb::ParquetBloomProbeBindData>_>
  _Var2;
  undefined8 uVar3;
  element_type *peVar4;
  _Head_base<0UL,_duckdb::ParquetBloomProbeBindData_*,_false> _Var5;
  reference pvVar6;
  pointer pPVar7;
  pointer pPVar8;
  ClientContext *context_00;
  InvalidInputException *this_01;
  pointer *__ptr;
  templated_unique_single_t result;
  templated_unique_single_t probe_bind_data;
  _Head_base<0UL,_duckdb::ParquetBloomProbeBindData_*,_false> local_c8;
  _Tuple_impl<0UL,_duckdb::ParquetBloomProbeBindData_*,_std::default_delete<duckdb::ParquetBloomProbeBindData>_>
  local_c0;
  Value local_b8;
  __uniq_ptr_impl<duckdb::FunctionData,_std::default_delete<duckdb::FunctionData>_> local_78;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
  *local_70;
  LogicalType local_68;
  string local_50;
  
  local_78._M_t.
  super__Tuple_impl<0UL,_duckdb::FunctionData_*,_std::default_delete<duckdb::FunctionData>_>.
  super__Head_base<0UL,_duckdb::FunctionData_*,_false>._M_head_impl =
       (tuple<duckdb::FunctionData_*,_std::default_delete<duckdb::FunctionData>_>)
       (tuple<duckdb::FunctionData_*,_std::default_delete<duckdb::FunctionData>_>)this;
  local_70 = names;
  local_c8._M_head_impl = (ParquetBloomProbeBindData *)operator_new(0x50);
  ((local_c8._M_head_impl)->super_ParquetMetaDataBindData).super_TableFunctionData.
  super_FunctionData._vptr_FunctionData = (_func_int **)0x0;
  ((local_c8._M_head_impl)->super_ParquetMetaDataBindData).super_TableFunctionData.column_ids.
  super_vector<unsigned_long,_std::allocator<unsigned_long>_>.
  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  ((local_c8._M_head_impl)->super_ParquetMetaDataBindData).super_TableFunctionData.column_ids.
  super_vector<unsigned_long,_std::allocator<unsigned_long>_>.
  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  ((local_c8._M_head_impl)->super_ParquetMetaDataBindData).super_TableFunctionData.column_ids.
  super_vector<unsigned_long,_std::allocator<unsigned_long>_>.
  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  ((local_c8._M_head_impl)->super_ParquetMetaDataBindData).return_types.
  super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
  super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  ((local_c8._M_head_impl)->super_ParquetMetaDataBindData).return_types.
  super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
  super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  ((local_c8._M_head_impl)->super_ParquetMetaDataBindData).return_types.
  super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
  super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  ((local_c8._M_head_impl)->super_ParquetMetaDataBindData).file_list.internal.
  super___shared_ptr<duckdb::MultiFileList,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)0x0
  ;
  ((local_c8._M_head_impl)->super_ParquetMetaDataBindData).file_list.internal.
  super___shared_ptr<duckdb::MultiFileList,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  ((local_c8._M_head_impl)->super_ParquetMetaDataBindData).multi_file_reader.
  super_unique_ptr<duckdb::MultiFileReader,_std::default_delete<duckdb::MultiFileReader>_>._M_t.
  super___uniq_ptr_impl<duckdb::MultiFileReader,_std::default_delete<duckdb::MultiFileReader>_>._M_t
  .super__Tuple_impl<0UL,_duckdb::MultiFileReader_*,_std::default_delete<duckdb::MultiFileReader>_>.
  super__Head_base<0UL,_duckdb::MultiFileReader_*,_false> =
       (_Head_base<0UL,_duckdb::MultiFileReader_*,_false>)0x0;
  ((local_c8._M_head_impl)->super_ParquetMetaDataBindData).super_TableFunctionData.
  super_FunctionData._vptr_FunctionData = (_func_int **)&PTR__ParquetMetaDataBindData_024be218;
  _Var5._M_head_impl = (ParquetBloomProbeBindData *)operator_new(0xb0);
  switchD_01306cb1::default(_Var5._M_head_impl,0,0xb0);
  ((_Var5._M_head_impl)->super_ParquetMetaDataBindData).multi_file_reader.
  super_unique_ptr<duckdb::MultiFileReader,_std::default_delete<duckdb::MultiFileReader>_>._M_t.
  super___uniq_ptr_impl<duckdb::MultiFileReader,_std::default_delete<duckdb::MultiFileReader>_>._M_t
  .super__Tuple_impl<0UL,_duckdb::MultiFileReader_*,_std::default_delete<duckdb::MultiFileReader>_>.
  super__Head_base<0UL,_duckdb::MultiFileReader_*,_false>._M_head_impl = (MultiFileReader *)0x0;
  ((_Var5._M_head_impl)->super_ParquetMetaDataBindData).file_list.internal.
  super___shared_ptr<duckdb::MultiFileList,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)0x0
  ;
  ((_Var5._M_head_impl)->super_ParquetMetaDataBindData).file_list.internal.
  super___shared_ptr<duckdb::MultiFileList,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  ((_Var5._M_head_impl)->super_ParquetMetaDataBindData).return_types.
  super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
  super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  ((_Var5._M_head_impl)->super_ParquetMetaDataBindData).return_types.
  super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
  super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  ((_Var5._M_head_impl)->super_ParquetMetaDataBindData).super_TableFunctionData.column_ids.
  super_vector<unsigned_long,_std::allocator<unsigned_long>_>.
  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  ((_Var5._M_head_impl)->super_ParquetMetaDataBindData).return_types.
  super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
  super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  ((_Var5._M_head_impl)->super_ParquetMetaDataBindData).super_TableFunctionData.column_ids.
  super_vector<unsigned_long,_std::allocator<unsigned_long>_>.
  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  ((_Var5._M_head_impl)->super_ParquetMetaDataBindData).super_TableFunctionData.column_ids.
  super_vector<unsigned_long,_std::allocator<unsigned_long>_>.
  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  ((_Var5._M_head_impl)->super_ParquetMetaDataBindData).super_TableFunctionData.super_FunctionData.
  _vptr_FunctionData = (_func_int **)&PTR__ParquetBloomProbeBindData_024be2a0;
  ((_Var5._M_head_impl)->probe_column_name)._M_dataplus._M_p =
       (pointer)&((_Var5._M_head_impl)->probe_column_name).field_2;
  ((_Var5._M_head_impl)->probe_column_name)._M_string_length = 0;
  ((_Var5._M_head_impl)->probe_column_name).field_2._M_local_buf[0] = '\0';
  LogicalType::LogicalType(&local_b8.type_,SQLNULL);
  Value::Value(&(_Var5._M_head_impl)->probe_constant,&local_b8.type_);
  LogicalType::~LogicalType(&local_b8.type_);
  local_c0.super__Head_base<0UL,_duckdb::ParquetBloomProbeBindData_*,_false>._M_head_impl =
       (_Head_base<0UL,_duckdb::ParquetBloomProbeBindData_*,_false>)
       (_Head_base<0UL,_duckdb::ParquetBloomProbeBindData_*,_false>)_Var5._M_head_impl;
  pvVar6 = vector<duckdb::Value,_true>::operator[](input->inputs,1);
  if (pvVar6->is_null == false) {
    pvVar6 = vector<duckdb::Value,_true>::operator[](input->inputs,2);
    if (pvVar6->is_null != true) {
      pvVar6 = vector<duckdb::Value,_true>::operator[](input->inputs,1);
      LogicalType::LogicalType(&local_68,VARCHAR);
      Value::CastAs(&local_b8,pvVar6,context,&local_68,false);
      Value::GetValue<std::__cxx11::string>(&local_50,&local_b8);
      pPVar7 = unique_ptr<duckdb::ParquetBloomProbeBindData,_std::default_delete<duckdb::ParquetBloomProbeBindData>,_true>
               ::operator->((unique_ptr<duckdb::ParquetBloomProbeBindData,_std::default_delete<duckdb::ParquetBloomProbeBindData>,_true>
                             *)&local_c0);
      ::std::__cxx11::string::operator=((string *)&pPVar7->probe_column_name,(string *)&local_50);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_50._M_dataplus._M_p != &local_50.field_2) {
        operator_delete(local_50._M_dataplus._M_p);
      }
      Value::~Value(&local_b8);
      LogicalType::~LogicalType(&local_68);
      pvVar6 = vector<duckdb::Value,_true>::operator[](input->inputs,2);
      pPVar7 = unique_ptr<duckdb::ParquetBloomProbeBindData,_std::default_delete<duckdb::ParquetBloomProbeBindData>,_true>
               ::operator->((unique_ptr<duckdb::ParquetBloomProbeBindData,_std::default_delete<duckdb::ParquetBloomProbeBindData>,_true>
                             *)&local_c0);
      Value::operator=(&pPVar7->probe_constant,pvVar6);
      _Var2.super__Head_base<0UL,_duckdb::ParquetBloomProbeBindData_*,_false>._M_head_impl =
           local_c0.super__Head_base<0UL,_duckdb::ParquetBloomProbeBindData_*,_false>._M_head_impl;
      _Var5._M_head_impl = local_c8._M_head_impl;
      local_c0.super__Head_base<0UL,_duckdb::ParquetBloomProbeBindData_*,_false>._M_head_impl =
           (_Head_base<0UL,_duckdb::ParquetBloomProbeBindData_*,_false>)
           (ParquetBloomProbeBindData *)0x0;
      local_c8 = _Var2.super__Head_base<0UL,_duckdb::ParquetBloomProbeBindData_*,_false>.
                 _M_head_impl;
      if (_Var5._M_head_impl != (ParquetBloomProbeBindData *)0x0) {
        (*((_Var5._M_head_impl)->super_ParquetMetaDataBindData).super_TableFunctionData.
          super_FunctionData._vptr_FunctionData[1])();
      }
      ParquetMetaDataOperatorData::BindBloomProbe(return_types,local_70);
      if (local_c0.super__Head_base<0UL,_duckdb::ParquetBloomProbeBindData_*,_false>._M_head_impl !=
          (ParquetBloomProbeBindData *)0x0) {
        (**(code **)(*(long *)local_c0.
                              super__Head_base<0UL,_duckdb::ParquetBloomProbeBindData_*,_false>.
                              _M_head_impl + 8))();
      }
      pPVar8 = unique_ptr<duckdb::ParquetMetaDataBindData,_std::default_delete<duckdb::ParquetMetaDataBindData>,_true>
               ::operator->((unique_ptr<duckdb::ParquetMetaDataBindData,_std::default_delete<duckdb::ParquetMetaDataBindData>,_true>
                             *)&local_c8);
      ::std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::operator=
                (&(pPVar8->return_types).
                  super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>,
                 &return_types->
                  super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>);
      MultiFileReader::Create((MultiFileReader *)&local_b8,input->table_function);
      pPVar8 = unique_ptr<duckdb::ParquetMetaDataBindData,_std::default_delete<duckdb::ParquetMetaDataBindData>,_true>
               ::operator->((unique_ptr<duckdb::ParquetMetaDataBindData,_std::default_delete<duckdb::ParquetMetaDataBindData>,_true>
                             *)&local_c8);
      uVar3 = local_b8.type_._0_8_;
      local_b8.type_._0_8_ = (element_type *)0x0;
      _Var1._M_head_impl =
           (pPVar8->multi_file_reader).
           super_unique_ptr<duckdb::MultiFileReader,_std::default_delete<duckdb::MultiFileReader>_>.
           _M_t.
           super___uniq_ptr_impl<duckdb::MultiFileReader,_std::default_delete<duckdb::MultiFileReader>_>
           ._M_t.
           super__Tuple_impl<0UL,_duckdb::MultiFileReader_*,_std::default_delete<duckdb::MultiFileReader>_>
           .super__Head_base<0UL,_duckdb::MultiFileReader_*,_false>._M_head_impl;
      (pPVar8->multi_file_reader).
      super_unique_ptr<duckdb::MultiFileReader,_std::default_delete<duckdb::MultiFileReader>_>._M_t.
      super___uniq_ptr_impl<duckdb::MultiFileReader,_std::default_delete<duckdb::MultiFileReader>_>.
      _M_t.
      super__Tuple_impl<0UL,_duckdb::MultiFileReader_*,_std::default_delete<duckdb::MultiFileReader>_>
      .super__Head_base<0UL,_duckdb::MultiFileReader_*,_false>._M_head_impl =
           (MultiFileReader *)uVar3;
      if (_Var1._M_head_impl != (MultiFileReader *)0x0) {
        (**(code **)((long)(_Var1._M_head_impl)->_vptr_MultiFileReader + 8))();
      }
      if ((element_type *)local_b8.type_._0_8_ != (element_type *)0x0) {
        (*(*(_func_int ***)local_b8.type_._0_8_)[1])();
      }
      pPVar8 = unique_ptr<duckdb::ParquetMetaDataBindData,_std::default_delete<duckdb::ParquetMetaDataBindData>,_true>
               ::operator->((unique_ptr<duckdb::ParquetMetaDataBindData,_std::default_delete<duckdb::ParquetMetaDataBindData>,_true>
                             *)&local_c8);
      context_00 = (ClientContext *)
                   unique_ptr<duckdb::MultiFileReader,_std::default_delete<duckdb::MultiFileReader>,_true>
                   ::operator->(&pPVar8->multi_file_reader);
      pvVar6 = vector<duckdb::Value,_true>::operator[](input->inputs,0);
      MultiFileReader::CreateFileList
                ((MultiFileReader *)&local_b8,context_00,(Value *)context,(FileGlobOptions)pvVar6);
      pPVar8 = unique_ptr<duckdb::ParquetMetaDataBindData,_std::default_delete<duckdb::ParquetMetaDataBindData>,_true>
               ::operator->((unique_ptr<duckdb::ParquetMetaDataBindData,_std::default_delete<duckdb::ParquetMetaDataBindData>,_true>
                             *)&local_c8);
      peVar4 = local_b8.type_.type_info_.internal.
               super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
      uVar3 = local_b8.type_._0_8_;
      local_b8.type_._0_8_ = (_func_int **)0x0;
      local_b8.type_.type_info_.internal.
      super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
           (element_type *)0x0;
      this_00 = (pPVar8->file_list).internal.
                super___shared_ptr<duckdb::MultiFileList,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                _M_pi;
      (pPVar8->file_list).internal.
      super___shared_ptr<duckdb::MultiFileList,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
           (element_type *)uVar3;
      (pPVar8->file_list).internal.
      super___shared_ptr<duckdb::MultiFileList,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
           (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)peVar4;
      if (this_00 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_00);
      }
      if (local_b8.type_.type_info_.internal.
          super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr !=
          (element_type *)0x0) {
        ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                   local_b8.type_.type_info_.internal.
                   super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr);
      }
      *(ParquetBloomProbeBindData **)
       local_78._M_t.
       super__Tuple_impl<0UL,_duckdb::FunctionData_*,_std::default_delete<duckdb::FunctionData>_>.
       super__Head_base<0UL,_duckdb::FunctionData_*,_false>._M_head_impl = local_c8._M_head_impl;
      return (unique_ptr<duckdb::FunctionData,_std::default_delete<duckdb::FunctionData>_>)
             (_Tuple_impl<0UL,_duckdb::FunctionData_*,_std::default_delete<duckdb::FunctionData>_>)
             local_78._M_t.
             super__Tuple_impl<0UL,_duckdb::FunctionData_*,_std::default_delete<duckdb::FunctionData>_>
             .super__Head_base<0UL,_duckdb::FunctionData_*,_false>._M_head_impl;
    }
  }
  this_01 = (InvalidInputException *)__cxa_allocate_exception(0x10);
  local_b8.type_._0_8_ =
       &local_b8.type_.type_info_.internal.
        super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount;
  ::std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_b8,"Can\'t have NULL parameters for parquet_bloom_probe","");
  InvalidInputException::InvalidInputException(this_01,(string *)&local_b8);
  __cxa_throw(this_01,&InvalidInputException::typeinfo,::std::runtime_error::~runtime_error);
}

Assistant:

unique_ptr<FunctionData> ParquetMetaDataBind(ClientContext &context, TableFunctionBindInput &input,
                                             vector<LogicalType> &return_types, vector<string> &names) {
	auto result = make_uniq<ParquetMetaDataBindData>();

	switch (TYPE) {
	case ParquetMetadataOperatorType::SCHEMA:
		ParquetMetaDataOperatorData::BindSchema(return_types, names);
		break;
	case ParquetMetadataOperatorType::META_DATA:
		ParquetMetaDataOperatorData::BindMetaData(return_types, names);
		break;
	case ParquetMetadataOperatorType::KEY_VALUE_META_DATA:
		ParquetMetaDataOperatorData::BindKeyValueMetaData(return_types, names);
		break;
	case ParquetMetadataOperatorType::FILE_META_DATA:
		ParquetMetaDataOperatorData::BindFileMetaData(return_types, names);
		break;
	case ParquetMetadataOperatorType::BLOOM_PROBE: {
		auto probe_bind_data = make_uniq<ParquetBloomProbeBindData>();
		D_ASSERT(input.inputs.size() == 3);
		if (input.inputs[1].IsNull() || input.inputs[2].IsNull()) {
			throw InvalidInputException("Can't have NULL parameters for parquet_bloom_probe");
		}
		probe_bind_data->probe_column_name = input.inputs[1].CastAs(context, LogicalType::VARCHAR).GetValue<string>();
		probe_bind_data->probe_constant = input.inputs[2];
		result = std::move(probe_bind_data);
		ParquetMetaDataOperatorData::BindBloomProbe(return_types, names);
		break;
	}
	default:
		throw InternalException("Unsupported ParquetMetadataOperatorType");
	}

	result->return_types = return_types;
	result->multi_file_reader = MultiFileReader::Create(input.table_function);
	result->file_list = result->multi_file_reader->CreateFileList(context, input.inputs[0]);

	return std::move(result);
}